

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

Gia_Man_t * Gia_ManCofStructure(Gia_Man_t *p)

{
  bool bVar1;
  Gia_Man_t *p_00;
  int iVar2;
  Vec_Int_t *vRes;
  Vec_Wec_t *vCofs;
  Vec_Int_t *p_01;
  Gia_Man_t *pNew;
  Vec_Int_t *vMap;
  Vec_Int_t *vIns;
  Gia_Man_t *local_40;
  Vec_Int_t *local_38;
  Vec_Int_t *local_30;
  
  local_40 = (Gia_Man_t *)0x0;
  vRes = Gia_ManFindSharedInputs(p);
  local_30 = vRes;
  if (vRes == (Vec_Int_t *)0x0) {
LAB_00200711:
    local_38 = (Vec_Int_t *)0x0;
    bVar1 = true;
    vCofs = (Vec_Wec_t *)0x0;
LAB_00200720:
    Gia_ManStopP(&local_40);
    if (bVar1) goto LAB_00200737;
  }
  else {
    vCofs = Gia_ManFindCofs(p,vRes,&local_40);
    if (vCofs == (Vec_Wec_t *)0x0) goto LAB_00200711;
    p_01 = Gia_ManFindEquivClasses(vCofs);
    local_38 = p_01;
    if (p_01 == (Vec_Int_t *)0x0) {
LAB_0020071e:
      bVar1 = false;
      goto LAB_00200720;
    }
    iVar2 = Vec_IntFindMax(p_01);
    iVar2 = Abc_Base2Log(iVar2 + 1);
    if (vRes->nSize <= iVar2) goto LAB_0020071e;
    Gia_ManFindDerive(local_40,p->vCos->nSize,vRes,vCofs,p_01);
    p_00 = local_40;
    local_40 = Gia_ManCleanup(local_40);
    Gia_ManStop(p_00);
  }
  Vec_WecFree(vCofs);
LAB_00200737:
  Vec_IntFreeP(&local_38);
  Vec_IntFreeP(&local_30);
  return local_40;
}

Assistant:

Gia_Man_t * Gia_ManCofStructure( Gia_Man_t * p )
{
    Gia_Man_t * pNew = NULL;
    Vec_Int_t * vIns = Gia_ManFindSharedInputs( p );
    Vec_Wec_t * vCfs = vIns ? Gia_ManFindCofs( p, vIns, &pNew ) : NULL;
    Vec_Int_t * vMap = vCfs ? Gia_ManFindEquivClasses( vCfs ) : NULL;
    if ( vMap && Abc_Base2Log(Vec_IntFindMax(vMap)+1) < Vec_IntSize(vIns) ) 
    {
        Gia_Man_t * pTemp; 
        Gia_ManFindDerive( pNew, Gia_ManCoNum(p), vIns, vCfs, vMap );
        pNew = Gia_ManCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
    }
    else
        Gia_ManStopP( &pNew );
    Vec_WecFreeP( &vCfs );
    Vec_IntFreeP( &vMap );
    Vec_IntFreeP( &vIns );
    return pNew;
}